

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

ON_String __thiscall
ON_String::HexadecimalFromBytes
          (ON_String *this,ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse)

{
  size_t array_capacity;
  bool bVar1;
  char *str;
  ON_String *this_00;
  undefined7 in_register_00000081;
  ON_String s;
  ON_String local_40;
  undefined4 local_34;
  
  if (bytes == (ON__UINT8 *)0x0 || byte_count == 0) {
    ON_String(this,&EmptyString);
  }
  else {
    local_34 = (undefined4)CONCAT71(in_register_00000081,bReverse);
    array_capacity = byte_count * 2;
    ON_String(&local_40);
    ReserveArray(&local_40,array_capacity);
    SetLength(&local_40,array_capacity);
    this_00 = &local_40;
    str = Array(this_00);
    bVar1 = ON_BytesToHexadecimalString
                      (bytes,byte_count,bCapitalDigits,local_34._0_1_,str,array_capacity);
    if (!bVar1) {
      this_00 = &EmptyString;
    }
    ON_String(this,this_00);
    ~ON_String(&local_40);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::HexadecimalFromBytes(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse
  )
{
  if (nullptr == bytes || byte_count <= 0)
    return ON_String::EmptyString;

  const size_t s_length = 2 * byte_count;
  ON_String s;
  s.ReserveArray(s_length);
  s.SetLength(s_length);
  if ( false == ON_BytesToHexadecimalString(bytes,byte_count,bCapitalDigits,bReverse,s.Array(),s_length) )
    return ON_String::EmptyString;

  return s;
}